

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Stream_New(FT_Library library,FT_Open_Args *args,FT_Stream *astream)

{
  uint uVar1;
  FT_Memory memory;
  unsigned_long uVar2;
  FT_Error FVar3;
  undefined8 in_RAX;
  FT_Stream stream;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  *astream = (FT_Stream)0x0;
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (args == (FT_Open_Args *)0x0) {
    return 6;
  }
  memory = library->memory;
  stream = (FT_Stream)ft_mem_alloc(memory,0x50,&local_34);
  if (local_34 != 0) {
    return local_34;
  }
  stream->memory = memory;
  uVar1 = args->flags;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 4) == 0) {
      FVar3 = 6;
      if (((uVar1 & 2) != 0) && (args->stream != (FT_Stream)0x0)) {
        (*memory->free)(memory,stream);
        stream = args->stream;
        goto LAB_00132cf3;
      }
    }
    else {
      FVar3 = FT_Stream_Open(stream,args->pathname);
      stream->pathname = (FT_StreamDesc)args->pathname;
      if (FVar3 == 0) goto LAB_00132cf3;
    }
    (*memory->free)(memory,stream);
    stream = (FT_Stream)0x0;
  }
  else {
    uVar2 = args->memory_size;
    stream->base = args->memory_base;
    stream->size = uVar2;
    stream->pos = 0;
    stream->cursor = (uchar *)0x0;
    stream->read = (FT_Stream_IoFunc)0x0;
    stream->close = (FT_Stream_CloseFunc)0x0;
LAB_00132cf3:
    stream->memory = memory;
    FVar3 = 0;
  }
  *astream = stream;
  return FVar3;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_New( FT_Library           library,
                 const FT_Open_Args*  args,
                 FT_Stream           *astream )
  {
    FT_Error   error;
    FT_Memory  memory;
    FT_Stream  stream = NULL;


    *astream = NULL;

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !args )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( FT_NEW( stream ) )
      goto Exit;

    stream->memory = memory;

    if ( args->flags & FT_OPEN_MEMORY )
    {
      /* create a memory-based stream */
      FT_Stream_OpenMemory( stream,
                            (const FT_Byte*)args->memory_base,
                            (FT_ULong)args->memory_size );
    }

#ifndef FT_CONFIG_OPTION_DISABLE_STREAM_SUPPORT

    else if ( args->flags & FT_OPEN_PATHNAME )
    {
      /* create a normal system stream */
      error = FT_Stream_Open( stream, args->pathname );
      stream->pathname.pointer = args->pathname;
    }
    else if ( ( args->flags & FT_OPEN_STREAM ) && args->stream )
    {
      /* use an existing, user-provided stream */

      /* in this case, we do not need to allocate a new stream object */
      /* since the caller is responsible for closing it himself       */
      FT_FREE( stream );
      stream = args->stream;
    }

#endif

    else
      error = FT_THROW( Invalid_Argument );

    if ( error )
      FT_FREE( stream );
    else
      stream->memory = memory;  /* just to be certain */

    *astream = stream;

  Exit:
    return error;
  }